

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

Solver * __thiscall
Clasp::SharedContext::startAddConstraints(SharedContext *this,uint32 constraintGuess)

{
  Solver *this_00;
  bool bVar1;
  SolverParams *params;
  uint uVar2;
  long *plVar3;
  
  bVar1 = unfreeze(this);
  if (bVar1) {
    uVar2 = 1;
    if (1 < ((this->step_).rep_ ^ 2)) {
      uVar2 = (uint)this->share_ >> 0x18 & 1;
    }
    ShortImplicationsGraph::resize(&this->btig_,(uVar2 + (this->varInfo_).ebo_.size) * 2);
    this_00 = *(this->solvers_).ebo_.buf;
    plVar3 = (long *)((this->config_).ptr_ & 0xfffffffffffffffe);
    params = (SolverParams *)(**(code **)(*plVar3 + 0x30))(plVar3,0);
    Solver::startInit(this_00,constraintGuess,params);
  }
  return *(this->solvers_).ebo_.buf;
}

Assistant:

Solver& SharedContext::startAddConstraints(uint32 constraintGuess) {
	if (!unfreeze()) { return *master(); }
	btig_.resize((numVars() + 1 + uint32(step_ == lit_false() || solveMode() == solve_multi))<<1);
	master()->startInit(constraintGuess, configuration()->solver(0));
	return *master();
}